

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addMemberDecoration(Builder *this,Id id,uint member,Decoration decoration,int num)

{
  Instruction *this_00;
  value_type local_30;
  Instruction *local_28;
  Instruction *dec;
  int num_local;
  Decoration decoration_local;
  uint member_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    dec._0_4_ = num;
    dec._4_4_ = decoration;
    num_local = member;
    decoration_local = id;
    _member_local = this;
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpMemberDecorate);
    local_28 = this_00;
    spv::Instruction::reserveOperands(this_00,3);
    spv::Instruction::addIdOperand(local_28,decoration_local);
    spv::Instruction::addImmediateOperand(local_28,num_local);
    spv::Instruction::addImmediateOperand(local_28,dec._4_4_);
    if (-1 < (int)(uint)dec) {
      spv::Instruction::addImmediateOperand(local_28,(uint)dec);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               local_28);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
  }
  return;
}

Assistant:

void Builder::addMemberDecoration(Id id, unsigned int member, Decoration decoration, int num)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpMemberDecorate);
    dec->reserveOperands(3);
    dec->addIdOperand(id);
    dec->addImmediateOperand(member);
    dec->addImmediateOperand(decoration);
    if (num >= 0)
        dec->addImmediateOperand(num);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}